

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QGraphicsItemPrivate::ExtraStruct>::moveAppend
          (QGenericArrayOps<QGraphicsItemPrivate::ExtraStruct> *this,ExtraStruct *b,ExtraStruct *e)

{
  ExtraStruct *this_00;
  ulong in_RDX;
  ulong in_RSI;
  ExtraStruct *in_RDI;
  ExtraStruct *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct>::begin
                        ((QArrayDataPointer<QGraphicsItemPrivate::ExtraStruct> *)0x99c9e7);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QGraphicsItemPrivate::ExtraStruct::ExtraStruct(this_00,in_RDI);
      local_10 = local_10 + 0x28;
      *(long *)((long)&(in_RDI->value).d.data + 8) =
           *(long *)((long)&(in_RDI->value).d.data + 8) + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }